

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::StructPackingPass::Process(StructPackingPass *this)

{
  IRContext *this_00;
  uint32_t id;
  Status SVar1;
  Instruction *structDef;
  ulong uVar2;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  structMemberTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  spv_position_t local_38;
  
  if (this->packingRules_ == Undefined) {
    if ((this->super_Pass).consumer_.super__Function_base._M_manager == (_Manager_type)0x0) {
      return Failure;
    }
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&(this->super_Pass).consumer_,SPV_MSG_ERROR,"",(spv_position_t *)&local_58,
               "Cannot pack struct with undefined rule");
    return Failure;
  }
  buildConstantsMap(this);
  id = findStructIdByName(this,(this->structToPack_)._M_dataplus._M_p);
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  structDef = analysis::DefUseManager::GetDef
                        ((this_00->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,id);
  if ((structDef == (Instruction *)0x0) || (structDef->opcode_ != OpTypeStruct)) {
    SVar1 = Failure;
    if ((this->super_Pass).consumer_.super__Function_base._M_manager == (_Manager_type)0x0) {
      return Failure;
    }
    std::operator+(&local_58,"Failed to find struct with name ",&this->structToPack_);
    local_38.line = 0;
    local_38.column = 0;
    local_38.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&(this->super_Pass).consumer_,SPV_MSG_ERROR,"",&local_38,local_58._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return Failure;
    }
    uVar2 = local_58.field_2._M_allocated_capacity + 1;
  }
  else {
    findStructMemberTypes
              ((vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                *)&local_58,this,structDef);
    SVar1 = assignStructMemberOffsets
                      (this,id,(vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                                *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return SVar1;
    }
    uVar2 = local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p;
  }
  operator_delete(local_58._M_dataplus._M_p,uVar2);
  return SVar1;
}

Assistant:

Pass::Status StructPackingPass::Process() {
  if (packingRules_ == PackingRules::Undefined) {
    if (consumer()) {
      consumer()(SPV_MSG_ERROR, "", {0, 0, 0},
                 "Cannot pack struct with undefined rule");
    }
    return Status::Failure;
  }

  // Build Id-to-instruction map for easier access
  buildConstantsMap();

  // Find structure of interest
  const uint32_t structIdToPack = findStructIdByName(structToPack_.c_str());

  const Instruction* structDef =
      context()->get_def_use_mgr()->GetDef(structIdToPack);
  if (structDef == nullptr || structDef->opcode() != spv::Op::OpTypeStruct) {
    if (consumer()) {
      const std::string message =
          "Failed to find struct with name " + structToPack_;
      consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
    }
    return Status::Failure;
  }

  // Find all struct member types
  std::vector<const analysis::Type*> structMemberTypes =
      findStructMemberTypes(*structDef);

  return assignStructMemberOffsets(structIdToPack, structMemberTypes);
}